

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall tonk::Connection::onDecodeFailure(Connection *this,Result *error)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  string local_1c0;
  undefined1 local_1a0 [392];
  
  if ((error->Error->Type != Tonk) || (error->Error->Code != 0xf)) {
    Result::ToJson_abi_cxx11_(&local_1c0,error);
    if ((int)(this->Logger).ChannelMinLevel < 5) {
      local_1a0._0_8_ = (this->Logger).ChannelName;
      this_00 = (ostringstream *)(local_1a0 + 0x10);
      local_1a0._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(this->Logger).Prefix._M_dataplus._M_p,
                 (this->Logger).Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Authenticated datagram decode failure: ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,9,error);
  }
  return;
}

Assistant:

void Connection::onDecodeFailure(const Result& error)
{
    TONK_DEBUG_ASSERT(error.IsFail());

    const bool isUnauthenticatedData = \
        error.Error->Type == ErrorType::Tonk &&
        error.Error->Code == Tonk_BogonData;

    if (isUnauthenticatedData)
    {
        // Disabled this log
        //Logger.Debug("Bogon data ignored: ", error.ToJson());
        return;
    }

    Logger.Error("Authenticated datagram decode failure: ", error.ToJson());
    SelfRefCount.StartShutdown(Tonk_InvalidData, error);
}